

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

int signo(int A,int B)

{
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  int tA2;
  int sig;
  int B_local;
  int A_local;
  
  i = 1;
  local_18 = A >> ((byte)tp & 0x1f) & B >> ((byte)tp & 0x1f);
  local_1c = 0;
  while( true ) {
    if (tp + tq <= local_1c) break;
    if ((B >> ((byte)local_1c & 0x1f) & 1U) != 0) {
      local_18 = local_18 ^ A >> ((byte)local_1c + 1 & 0x1f);
    }
    local_1c = local_1c + 1;
  }
  if (((ulong)((((local_18 - ((int)local_18 >> 1 & 0x77777777U)) -
                ((int)local_18 >> 2 & 0x33333333U)) - ((int)local_18 >> 3 & 0x11111111U)) +
               ((int)(((local_18 - ((int)local_18 >> 1 & 0x77777777U)) -
                      ((int)local_18 >> 2 & 0x33333333U)) - ((int)local_18 >> 3 & 0x11111111U)) >> 4
               ) & 0xf0f0f0f) % 0xff & 1) != 0) {
    i = -1;
  }
  return i;
}

Assistant:

int signo(int A,int B)
{
	int sig=1;
	int tA2=((A>>tp)&(B>>tp));
	//int tA2=0; 
	for(register int i=0;i<(tp+tq);i++)
	{
		if((B>>i)&1)
			tA2=tA2^(A>>(i+1));
	}

	if(bits(tA2)&1){sig=-1;}

//return bits(tA2)&1;
return sig;
}